

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O0

int save_load_flat_example(io_buf *model_file,bool read,flat_example **fec)

{
  long lVar1;
  float *pfVar2;
  flat_example *pfVar3;
  size_t sVar4;
  char *pcVar5;
  v_array<float> *this;
  size_t sVar6;
  float **ppfVar7;
  unsigned_long **ppuVar8;
  ostream *poVar9;
  long *in_RDX;
  byte in_SIL;
  char *in_RDI;
  size_t len;
  features *fs;
  size_t brw;
  size_t in_stack_00000118;
  char *in_stack_00000120;
  size_t in_stack_00000128;
  char *in_stack_00000130;
  io_buf *in_stack_00000138;
  v_array<float> *in_stack_00000140;
  size_t in_stack_ffffffffffffff50;
  unsigned_long *puVar10;
  char *in_stack_ffffffffffffff58;
  io_buf *in_stack_ffffffffffffff60;
  io_buf *this_00;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  float *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  if ((in_SIL & 1) == 0) {
    sVar4 = io_buf::bin_write_fixed
                      (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50
                      );
    if (sVar4 == 0) {
      return 1;
    }
    if ((*(long *)(*in_RDX + 0x28) != 0) &&
       (sVar4 = io_buf::bin_write_fixed
                          (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                           in_stack_ffffffffffffff50), sVar4 == 0)) {
      poVar9 = (ostream *)std::ostream::operator<<(&std::cerr,*(ulong *)(*in_RDX + 0x28));
      poVar9 = std::operator<<(poVar9," ");
      poVar9 = std::operator<<(poVar9,*(char **)(*in_RDX + 0x30));
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      return 2;
    }
    sVar4 = features::size((features *)0x2fad23);
    if (sVar4 != 0) {
      ppfVar7 = v_array<float>::begin((v_array<float> *)(*in_RDX + 0x60));
      this_00 = (io_buf *)*ppfVar7;
      features::size((features *)0x2fad6a);
      sVar4 = io_buf::bin_write_fixed(this_00,in_RDI,in_stack_ffffffffffffff50);
      if (sVar4 == 0) {
        return 3;
      }
      ppuVar8 = v_array<unsigned_long>::begin((v_array<unsigned_long> *)(*in_RDX + 0x80));
      puVar10 = *ppuVar8;
      v_array<unsigned_long>::size((v_array<unsigned_long> *)(*in_RDX + 0x80));
      sVar4 = io_buf::bin_write_fixed(this_00,in_RDI,(size_t)puVar10);
      if (sVar4 == 0) {
        return 3;
      }
    }
  }
  else {
    pfVar3 = calloc_or_throw<flat_example>();
    *in_RDX = (long)pfVar3;
    sVar4 = io_buf::bin_read_fixed
                      (in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000120);
    if (sVar4 == 0) {
      return 1;
    }
    if (*(long *)(*in_RDX + 0x28) != 0) {
      pcVar5 = calloc_or_throw<char>(in_stack_00000118);
      *(char **)(*in_RDX + 0x30) = pcVar5;
      sVar4 = io_buf::bin_read_fixed
                        (in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000120);
      if (sVar4 == 0) {
        return 2;
      }
    }
    sVar4 = features::size((features *)0x2fa9e6);
    if (sVar4 != 0) {
      lVar1 = *in_RDX;
      this = (v_array<float> *)(lVar1 + 0x60);
      sVar4 = features::size((features *)0x2faa14);
      v_init<float>();
      this->_begin = local_58;
      *(undefined8 *)(lVar1 + 0x68) = local_50;
      *(undefined8 *)(lVar1 + 0x70) = local_48;
      *(undefined8 *)(lVar1 + 0x78) = local_40;
      v_array<float>::resize(in_stack_00000140,(size_t)in_stack_00000138);
      v_array<float>::begin(this);
      sVar6 = io_buf::bin_read_fixed
                        (in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000120);
      if (sVar6 == 0) {
        return 3;
      }
      ppfVar7 = v_array<float>::begin(this);
      pfVar2 = *ppfVar7;
      ppfVar7 = v_array<float>::end(this);
      *ppfVar7 = pfVar2 + sVar4;
      sVar4 = v_array<unsigned_long>::size((v_array<unsigned_long> *)(lVar1 + 0x80));
      v_init<unsigned_long>();
      *(undefined8 *)(lVar1 + 0x80) = local_78;
      *(undefined8 *)(lVar1 + 0x88) = local_70;
      *(undefined8 *)(lVar1 + 0x90) = local_68;
      *(undefined8 *)(lVar1 + 0x98) = local_60;
      v_array<unsigned_long>::resize
                ((v_array<unsigned_long> *)in_stack_00000140,(size_t)in_stack_00000138);
      v_array<unsigned_long>::begin((v_array<unsigned_long> *)(lVar1 + 0x80));
      sVar6 = io_buf::bin_read_fixed
                        (in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000120);
      if (sVar6 == 0) {
        return 3;
      }
      ppuVar8 = v_array<unsigned_long>::begin((v_array<unsigned_long> *)(lVar1 + 0x80));
      puVar10 = *ppuVar8;
      ppuVar8 = v_array<unsigned_long>::end((v_array<unsigned_long> *)(lVar1 + 0x80));
      *ppuVar8 = puVar10 + sVar4;
    }
  }
  return 0;
}

Assistant:

int save_load_flat_example(io_buf& model_file, bool read, flat_example*& fec)
{
  size_t brw = 1;
  if (read)
  {
    fec = &calloc_or_throw<flat_example>();
    brw = model_file.bin_read_fixed((char*)fec, sizeof(flat_example), "");

    if (brw > 0)
    {
      if (fec->tag_len > 0)
      {
        fec->tag = calloc_or_throw<char>(fec->tag_len);
        brw = model_file.bin_read_fixed((char*)fec->tag, fec->tag_len * sizeof(char), "");
        if (!brw)
          return 2;
      }
      if (fec->fs.size() > 0)
      {
        features& fs = fec->fs;
        size_t len = fs.size();
        fs.values = v_init<feature_value>();
        fs.values.resize(len);
        brw = model_file.bin_read_fixed((char*)fs.values.begin(), len * sizeof(feature_value), "");
        if (!brw)
          return 3;
        fs.values.end() = fs.values.begin() + len;

        len = fs.indicies.size();
        fs.indicies = v_init<feature_index>();
        fs.indicies.resize(len);
        brw = model_file.bin_read_fixed((char*)fs.indicies.begin(), len * sizeof(feature_index), "");
        if (!brw)
          return 3;
        fs.indicies.end() = fs.indicies.begin() + len;
      }
    }
    else
      return 1;
  }
  else
  {
    brw = model_file.bin_write_fixed((char*)fec, sizeof(flat_example));

    if (brw > 0)
    {
      if (fec->tag_len > 0)
      {
        brw = model_file.bin_write_fixed((char*)fec->tag, (uint32_t)fec->tag_len * sizeof(char));
        if (!brw)
        {
          cerr << fec->tag_len << " " << fec->tag << endl;
          return 2;
        }
      }
      if (fec->fs.size() > 0)
      {
        brw =
            model_file.bin_write_fixed((char*)fec->fs.values.begin(), (uint32_t)fec->fs.size() * sizeof(feature_value));
        if (!brw)
          return 3;
        brw = model_file.bin_write_fixed(
            (char*)fec->fs.indicies.begin(), (uint32_t)fec->fs.indicies.size() * sizeof(feature_index));
        if (!brw)
          return 3;
      }
    }
    else
      return 1;
  }
  return 0;
}